

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::callRunPostsolve(Highs *this,HighsSolution *solution,HighsBasis *basis)

{
  bool bVar1;
  HighsPostsolveStatus HVar2;
  HighsStatus HVar3;
  HighsLp *pHVar4;
  size_type sVar5;
  int *piVar6;
  double *__b;
  reference pvVar7;
  double *pdVar8;
  HighsLogOptions *log_options_;
  char *pcVar9;
  undefined8 uVar10;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar11;
  bool undo_mods_1;
  bool undo_mods;
  HighsLp *incumbent_lp;
  HighsOptions save_options;
  HighsPostsolveStatus postsolve_status_1;
  bool dual_supplied;
  HighsInt iCol;
  double *max_integrality_violation;
  HighsLp *lp;
  HighsPostsolveStatus postsolve_status;
  bool basis_supplied;
  HighsLp *presolved_lp;
  HighsStatus call_status;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffff998;
  HighsModelStatus in_stack_fffffffffffff99c;
  undefined4 in_stack_fffffffffffff9a0;
  HighsModelStatus in_stack_fffffffffffff9a4;
  Highs *in_stack_fffffffffffff9a8;
  HighsInt i_clock;
  allocator *paVar12;
  HighsLp *in_stack_fffffffffffff9b0;
  HighsOptions *in_stack_fffffffffffff9b8;
  HighsOptions *in_stack_fffffffffffff9c0;
  HighsInt in_stack_fffffffffffff9cc;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  HighsSolution *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  HighsStatus in_stack_fffffffffffff9e4;
  long in_stack_fffffffffffff9e8;
  HighsLogOptions *in_stack_fffffffffffff9f0;
  byte local_602;
  byte local_601;
  allocator local_5f1;
  string local_5f0 [43];
  undefined1 in_stack_fffffffffffffa3b;
  HighsStatus in_stack_fffffffffffffa3c;
  Highs *in_stack_fffffffffffffa40;
  HighsInfo *in_stack_fffffffffffffa70;
  HighsBasis *in_stack_fffffffffffffa78;
  HighsSolution *in_stack_fffffffffffffa80;
  HighsModel *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  Highs *in_stack_fffffffffffffa98;
  allocator local_541;
  string local_540 [135];
  undefined1 local_4b9 [1081];
  double local_68;
  int iVar13;
  HighsStatus local_4;
  
  pHVar4 = PresolveComponent::getReducedProblem((PresolveComponent *)(in_RDI + 0x4c08));
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 8));
  if ((int)sVar5 == pHVar4->num_col_) {
    sVar5 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                       (in_RDX + 0x30));
    local_601 = 1;
    if (sVar5 == 0) {
      sVar5 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                         (in_RDX + 0x48));
      local_601 = 1;
      if (sVar5 == 0) {
        local_601 = *in_RDX;
      }
    }
    if (((local_601 & 1) == 0) ||
       (bVar1 = isBasisConsistent((HighsLp *)in_stack_fffffffffffff9a8,
                                  (HighsBasis *)
                                  CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0)),
       bVar1)) {
      HighsSolution::operator=
                ((HighsSolution *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (HighsSolution *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      std::vector<double,_std::allocator<double>_>::assign
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                 (value_type_conflict1 *)0x497fd8);
      *(undefined1 *)(in_RDI + 0x50c8) = 1;
      bVar1 = HighsModel::isMip((HighsModel *)0x497ff0);
      if ((bVar1) && ((*in_RDX & 1) == 0)) {
        *(undefined1 *)(in_RDI + 0x50c9) = 0;
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x498031);
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x498051);
        *(undefined1 *)(in_RDI + 0x5130) = 0;
        HVar2 = runPostsolve(in_stack_fffffffffffff9a8);
        if (HVar2 == kSolutionRecovered) {
          HighsSolution::operator=
                    ((HighsSolution *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     (HighsSolution *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998))
          ;
          *(undefined4 *)(in_RDI + 0x1244) = 0xf;
          HighsInfo::invalidate((HighsInfo *)(in_RDI + 0xea8));
          piVar6 = (int *)(in_RDI + 0x138);
          dVar11 = computeObjectiveValue
                             (in_stack_fffffffffffff9b0,(HighsSolution *)in_stack_fffffffffffff9a8);
          *(double *)(in_RDI + 0xee0) = dVar11;
          getKktFailures((HighsOptions *)
                         CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                         in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          __b = (double *)(in_RDI + 0xef8);
          *__b = 0.0;
          for (iVar13 = 0; iVar13 < *piVar6; iVar13 = iVar13 + 1) {
            pvVar7 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                               ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                (piVar6 + 0x5e),(long)iVar13);
            if (*pvVar7 == kInteger) {
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)iVar13);
              local_68 = fractionality<double>
                                   ((double)CONCAT44(in_stack_fffffffffffff9a4,
                                                     in_stack_fffffffffffff9a0),
                                    (double *)
                                    CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
              pdVar8 = std::max<double>(&local_68,__b);
              *__b = *pdVar8;
            }
          }
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                       "Postsolve performed for MIP, but model status cannot be known\n");
        }
        else {
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"Postsolve return status is %d\n",
                       (ulong)(uint)HVar2);
          setHighsModelStatusAndClearSolutionAndBasis
                    ((Highs *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     in_stack_fffffffffffff99c);
        }
      }
      else {
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50e8));
        local_602 = 1;
        if (sVar5 == 0) {
          sVar5 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5118));
          local_602 = 1;
          if (sVar5 == 0) {
            local_602 = *(byte *)(in_RDI + 0x50c9);
          }
        }
        if ((local_602 & 1) == 0) {
          *(undefined1 *)(in_RDI + 0x50c9) = 0;
        }
        else {
          bVar1 = isDualSolutionRightSize
                            ((HighsLp *)
                             CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             (HighsSolution *)
                             CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
          if (!bVar1) {
            highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                         "Dual solution provided to postsolve is incorrect size\n");
            return kError;
          }
          *(undefined1 *)(in_RDI + 0x50c9) = 1;
        }
        HighsBasis::operator=
                  ((HighsBasis *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   (HighsBasis *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
        *(byte *)(in_RDI + 0x5130) = local_601 & 1;
        HVar2 = runPostsolve(in_stack_fffffffffffff9a8);
        if (HVar2 != kSolutionRecovered) {
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"Postsolve return status is %d\n",
                       (ulong)(uint)HVar2);
          setHighsModelStatusAndClearSolutionAndBasis
                    ((Highs *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     in_stack_fffffffffffff99c);
          HVar3 = returnFromRun(in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                (bool)in_stack_fffffffffffffa3b);
          return HVar3;
        }
        highsLogDev((HighsLogOptions *)(in_RDI + 0xe28),kVerbose,"Postsolve finished\n");
        HighsSolution::clear
                  ((HighsSolution *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
        HighsSolution::operator=
                  ((HighsSolution *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   (HighsSolution *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
        if ((*(byte *)(in_RDI + 9) & 1) == 0) {
          std::vector<double,_std::allocator<double>_>::assign
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                     (value_type_conflict1 *)0x49843b);
          std::vector<double,_std::allocator<double>_>::assign
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                     (value_type_conflict1 *)0x49846b);
        }
        HighsBasis::operator=
                  ((HighsBasis *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                   (HighsBasis *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
        std::__cxx11::string::operator+=((string *)(in_RDI + 0x80),": after postsolve");
        if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
          HighsBasis::clear((HighsBasis *)
                            CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
          dVar11 = HighsLp::objectiveValue
                             ((HighsLp *)in_stack_fffffffffffff9c0,
                              (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9b8);
          *(double *)(in_RDI + 0xee0) = dVar11;
          getLpKktFailures((HighsOptions *)
                           CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                           &in_stack_fffffffffffffa88->lp_,in_stack_fffffffffffffa80,
                           in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          if ((*(int *)(in_RDI + 0xf00) == 0) && (*(int *)(in_RDI + 0xf18) == 0)) {
            *(undefined4 *)(in_RDI + 0x1244) = 7;
          }
          else {
            *(undefined4 *)(in_RDI + 0x1244) = 0xf;
          }
          log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
          pcVar9 = "";
          if ((*(byte *)(in_RDI + 9) & 1) != 0) {
            pcVar9 = "and dual ";
          }
          modelStatusToString_abi_cxx11_(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
          uVar10 = std::__cxx11::string::c_str();
          highsLogUser(log_options_,kInfo,
                       "Pure postsolve yields primal %ssolution, but no basis: model status is %s\n"
                       ,pcVar9,uVar10);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffa98);
        }
        else {
          HighsOptions::HighsOptions(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
          i_clock = (HighsInt)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
          *(undefined4 *)(in_RDI + 0xc0c) = 0;
          *(undefined4 *)(in_RDI + 0xc28) = 1;
          *(undefined4 *)(in_RDI + 0xc2c) = 1;
          local_4b9._49_8_ = in_RDI + 0x138;
          refineBasis((HighsLp *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                      in_stack_fffffffffffff9d8,
                      (HighsBasis *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
          HEkk::invalidate((HEkk *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
          std::__cxx11::string::operator=((string *)(in_RDI + 0x3828),"Postsolve LP");
          HighsTimer::start((HighsTimer *)in_stack_fffffffffffff9b0,i_clock);
          in_stack_fffffffffffff9f0 = (HighsLogOptions *)local_4b9;
          in_stack_fffffffffffff9e8 = local_4b9._49_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_4b9 + 1),
                     "Solving the original LP from the solution after postsolve",
                     (allocator *)in_stack_fffffffffffff9f0);
          in_stack_fffffffffffff9e4 =
               callSolveLp(in_stack_fffffffffffffa98,
                           (HighsLp *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                           (string *)in_stack_fffffffffffffa88);
          std::__cxx11::string::~string((string *)(local_4b9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_4b9);
          HighsTimer::stop((HighsTimer *)
                           CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           in_stack_fffffffffffff9cc);
          HighsLogOptions::HighsLogOptions
                    ((HighsLogOptions *)
                     CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     (HighsLogOptions *)
                     CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
          paVar12 = &local_541;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_540,"callSolveLp",paVar12);
          HVar3 = interpretCallStatus(in_stack_fffffffffffff9f0,
                                      (HighsStatus)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                      (HighsStatus)in_stack_fffffffffffff9e8,
                                      (string *)
                                      CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0))
          ;
          std::__cxx11::string::~string(local_540);
          std::allocator<char>::~allocator((allocator<char> *)&local_541);
          HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4986b1);
          HighsOptions::operator=
                    ((HighsOptions *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     (HighsOptions *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
          if (HVar3 == kError) {
            local_4 = returnFromRun(in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                    (bool)in_stack_fffffffffffffa3b);
          }
          HighsOptions::~HighsOptions
                    ((HighsOptions *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
          if (HVar3 == kError) {
            return local_4;
          }
        }
      }
      highsStatusFromHighsModelStatus(*(HighsModelStatus *)(in_RDI + 0x1244));
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      paVar12 = &local_5f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,"highsStatusFromHighsModelStatus",paVar12);
      local_4 = interpretCallStatus(in_stack_fffffffffffff9f0,
                                    (HighsStatus)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                                    (HighsStatus)in_stack_fffffffffffff9e8,
                                    (string *)
                                    CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      std::__cxx11::string::~string(local_5f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x498a75);
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Basis provided to postsolve is incorrect size or inconsistent\n");
      local_4 = kError;
    }
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Primal solution provided to postsolve is incorrect size\n");
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::callRunPostsolve(const HighsSolution& solution,
                                    const HighsBasis& basis) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  const HighsLp& presolved_lp = presolve_.getReducedProblem();

  // Must at least have a primal column solution of the right size
  if (HighsInt(solution.col_value.size()) != presolved_lp.num_col_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Primal solution provided to postsolve is incorrect size\n");
    return HighsStatus::kError;
  }
  // Check any basis that is supplied
  const bool basis_supplied =
      basis.col_status.size() > 0 || basis.row_status.size() > 0 || basis.valid;
  if (basis_supplied) {
    if (!isBasisConsistent(presolved_lp, basis)) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Basis provided to postsolve is incorrect size or inconsistent\n");
      return HighsStatus::kError;
    }
  }
  // Copy in the solution provided
  presolve_.data_.recovered_solution_ = solution;
  // Ignore any row values
  presolve_.data_.recovered_solution_.row_value.assign(presolved_lp.num_row_,
                                                       0);
  presolve_.data_.recovered_solution_.value_valid = true;

  if (this->model_.isMip() && !basis.valid) {
    // Postsolving a MIP without a valid basis - which, if valid,
    // would imply that the relaxation had been solved, a case handled
    // below
    //
    // Ignore any dual values
    presolve_.data_.recovered_solution_.dual_valid = false;
    presolve_.data_.recovered_solution_.col_dual.clear();
    presolve_.data_.recovered_solution_.row_dual.clear();
    // Ignore any basis
    presolve_.data_.recovered_basis_.valid = false;

    HighsPostsolveStatus postsolve_status = runPostsolve();

    if (postsolve_status == HighsPostsolveStatus::kSolutionRecovered) {
      this->solution_ = presolve_.data_.recovered_solution_;
      this->model_status_ = HighsModelStatus::kUnknown;
      this->info_.invalidate();
      HighsLp& lp = this->model_.lp_;
      this->info_.objective_function_value =
          computeObjectiveValue(lp, this->solution_);
      getKktFailures(this->options_, this->model_, this->solution_,
                     this->basis_, this->info_);
      double& max_integrality_violation = this->info_.max_integrality_violation;
      max_integrality_violation = 0;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        if (lp.integrality_[iCol] == HighsVarType::kInteger) {
          max_integrality_violation =
              std::max(fractionality(this->solution_.col_value[iCol]),
                       max_integrality_violation);
        }
      }
      highsLogUser(
          options_.log_options, HighsLogType::kWarning,
          "Postsolve performed for MIP, but model status cannot be known\n");
    } else {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Postsolve return status is %d\n", (int)postsolve_status);
      setHighsModelStatusAndClearSolutionAndBasis(
          HighsModelStatus::kPostsolveError);
    }
  } else {
    // Postsolving an LP, or a MIP after solving the relaxation
    // (identified by passing a valid basis).
    //
    // If there are dual values, make sure that both vectors are the
    // right size
    const bool dual_supplied =
        presolve_.data_.recovered_solution_.col_dual.size() > 0 ||
        presolve_.data_.recovered_solution_.row_dual.size() > 0 ||
        presolve_.data_.recovered_solution_.dual_valid;
    if (dual_supplied) {
      if (!isDualSolutionRightSize(presolved_lp,
                                   presolve_.data_.recovered_solution_)) {
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "Dual solution provided to postsolve is incorrect size\n");
        return HighsStatus::kError;
      }
      presolve_.data_.recovered_solution_.dual_valid = true;
    } else {
      presolve_.data_.recovered_solution_.dual_valid = false;
    }
    // Copy in the basis provided. It's already been checked for
    // consistency, so the basis is valid iff it was supplied
    presolve_.data_.recovered_basis_ = basis;
    presolve_.data_.recovered_basis_.valid = basis_supplied;

    HighsPostsolveStatus postsolve_status = runPostsolve();

    if (postsolve_status == HighsPostsolveStatus::kSolutionRecovered) {
      highsLogDev(options_.log_options, HighsLogType::kVerbose,
                  "Postsolve finished\n");
      // Set solution and its status
      solution_.clear();
      solution_ = presolve_.data_.recovered_solution_;
      assert(solution_.value_valid);
      if (!solution_.dual_valid) {
        solution_.col_dual.assign(model_.lp_.num_col_, 0);
        solution_.row_dual.assign(model_.lp_.num_row_, 0);
      }
      basis_ = presolve_.data_.recovered_basis_;
      // Validity of the solution and basis should be inherited
      //
      // solution_.value_valid = true;
      // solution_.dual_valid = true;
      //
      // Set basis and its status
      //
      // basis_.valid = true;
      // basis_.useful = true;
      // basis_.col_status = presolve_.data_.recovered_basis_.col_status;
      // basis_.row_status = presolve_.data_.recovered_basis_.row_status;
      basis_.debug_origin_name += ": after postsolve";
      if (basis_.valid) {
        // Save the options to allow the best simplex strategy to be
        // used
        HighsOptions save_options = options_;
        options_.simplex_strategy = kSimplexStrategyChoose;
        // Ensure that the parallel solver isn't used
        options_.simplex_min_concurrency = 1;
        options_.simplex_max_concurrency = 1;
        // Use any pivot threshold resulting from solving the presolved LP
        // if (factor_pivot_threshold > 0)
        //    options_.factor_pivot_threshold = factor_pivot_threshold;
        // The basis returned from postsolve is just basic/nonbasic
        // and EKK expects a refined basis, so set it up now
        HighsLp& incumbent_lp = model_.lp_;
        refineBasis(incumbent_lp, solution_, basis_);
        // Scrap the EKK data from solving the presolved LP
        ekk_instance_.invalidate();
        ekk_instance_.lp_name_ = "Postsolve LP";
        // Set up the timing record so that adding the corresponding
        // values after callSolveLp gives difference
        timer_.start(timer_.solve_clock);
        call_status = callSolveLp(
            incumbent_lp,
            "Solving the original LP from the solution after postsolve");
        // Determine the timing record
        timer_.stop(timer_.solve_clock);
        return_status = interpretCallStatus(options_.log_options, call_status,
                                            return_status, "callSolveLp");
        // Recover the options
        options_ = save_options;
        if (return_status == HighsStatus::kError) {
          // Set undo_mods = false, since passing models requiring
          // modification to Highs::presolve is illegal
          const bool undo_mods = false;
          return returnFromRun(return_status, undo_mods);
        }
      } else {
        basis_.clear();
        info_.objective_function_value =
            model_.lp_.objectiveValue(solution_.col_value);
        getLpKktFailures(options_, model_.lp_, solution_, basis_, info_);
        if (info_.num_primal_infeasibilities == 0 &&
            info_.num_dual_infeasibilities == 0) {
          model_status_ = HighsModelStatus::kOptimal;
        } else {
          model_status_ = HighsModelStatus::kUnknown;
        }
        highsLogUser(
            options_.log_options, HighsLogType::kInfo,
            "Pure postsolve yields primal %ssolution, but no basis: model "
            "status is %s\n",
            solution_.dual_valid ? "and dual " : "",
            modelStatusToString(model_status_).c_str());
      }
    } else {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Postsolve return status is %d\n", (int)postsolve_status);
      setHighsModelStatusAndClearSolutionAndBasis(
          HighsModelStatus::kPostsolveError);
      // Set undo_mods = false, since passing models requiring
      // modification to Highs::presolve is illegal
      const bool undo_mods = false;
      return returnFromRun(HighsStatus::kError, undo_mods);
    }
  }
  call_status = highsStatusFromHighsModelStatus(model_status_);
  return_status =
      interpretCallStatus(options_.log_options, call_status, return_status,
                          "highsStatusFromHighsModelStatus");
  return return_status;
}